

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void sysbvm_weakValueDictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  long lVar5;
  long lStack_60;
  anon_struct_32_4_8173420c gcFrame;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&gcFrame;
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    gcFrame.association = (sysbvm_weakValueAssociation_t *)0x0;
    local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_38._12_4_ = 0;
    local_28 = 4;
    gcFrame.dictionary = (sysbvm_weakValueDictionary_t *)dictionary;
    gcFrame.key = key;
    gcFrame.value = value;
    sysbvm_stackFrame_pushRecord(&local_38);
    lStack_60 = sysbvm_dictionary_scanFor(context,&gcFrame.dictionary,&gcFrame.key);
    if (lStack_60 < 0) {
      sysbvm_weakValueDictionary_increaseCapacity(context,&gcFrame.dictionary);
      lStack_60 = sysbvm_dictionary_scanFor(context,&gcFrame.dictionary,&gcFrame.key);
      if (lStack_60 < 0) {
        sysbvm_error("Dictionary out of memory.");
        lStack_60 = -1;
      }
    }
    sVar3 = (gcFrame.dictionary)->storage;
    gcFrame.association = *(sysbvm_weakValueAssociation_t **)(sVar3 + 0x10 + lStack_60 * 8);
    if (gcFrame.association == (sysbvm_weakValueAssociation_t *)0x0) {
      sVar2 = sysbvm_weakValueAssociation_create(context,gcFrame.key,gcFrame.value);
      *(sysbvm_tuple_t *)(sVar3 + 0x10 + lStack_60 * 8) = sVar2;
      uVar4 = (gcFrame.dictionary)->storage;
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar4 = 0;
      }
      uVar1 = (gcFrame.dictionary)->size;
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        lVar5 = (long)uVar1 >> 4;
      }
      else {
        lVar5 = *(long *)(uVar1 + 0x10);
      }
      sVar3 = sysbvm_tuple_size_encode(context,lVar5 + 1U);
      (gcFrame.dictionary)->size = sVar3;
      if (uVar4 <= lVar5 + 1U) {
        sysbvm_weakValueDictionary_increaseCapacity(context,&gcFrame.dictionary);
      }
    }
    else {
      (gcFrame.association)->value = gcFrame.value;
    }
    sysbvm_stackFrame_popRecord(&local_38);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_weakValueDictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary)) return;

    struct {
        sysbvm_weakValueDictionary_t *dictionary;
        sysbvm_tuple_t key;
        sysbvm_tuple_t value;
        sysbvm_weakValueAssociation_t *association;
    } gcFrame = {
        .dictionary = (sysbvm_weakValueDictionary_t*)dictionary,
        .key = key,
        .value = value,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    intptr_t elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
    if(elementIndex < 0)
    {
        sysbvm_weakValueDictionary_increaseCapacity(context, &gcFrame.dictionary);
        elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_array_t *storage = (sysbvm_array_t*)gcFrame.dictionary->storage;
    gcFrame.association = (sysbvm_weakValueAssociation_t*)storage->elements[elementIndex];
    if(gcFrame.association)
    {
        gcFrame.association->value = gcFrame.value;
    }
    else
    {
        storage->elements[elementIndex] = sysbvm_weakValueAssociation_create(context, gcFrame.key, gcFrame.value);
        size_t capacity = sysbvm_tuple_getSizeInSlots(gcFrame.dictionary->storage);
        size_t newSize = sysbvm_tuple_size_decode(gcFrame.dictionary->size) + 1;
        gcFrame.dictionary->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_weakValueDictionary_increaseCapacity(context, &gcFrame.dictionary);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}